

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitOnceTest_random_view_Test<wchar_t>::TestBody(SplitOnceTest_random_view_Test<wchar_t> *this)

{
  bool bVar1;
  reference rhs;
  char *pcVar2;
  wchar_t *in_delim;
  AssertHelper local_108 [8];
  Message local_100 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f8;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  Message local_c0 [8];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_98 [8];
  pair<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>
  split_result;
  RandomTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  data;
  SplitOnceTest_random_view_Test<wchar_t> *this_local;
  
  in_delim = (wchar_t *)0x0;
  data.m_tokens.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  RandomTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::RandomTestData((RandomTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    *)&split_result.second._M_str,L'\0',0,0);
  jessilib::split_once_view<,std::__cxx11::wstring,wchar_t>
            ((pair<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>
              *)local_98,(jessilib *)&data.m_fixed_word_length,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &default_delim<wchar_t>,in_delim);
  rhs = std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      *)((long)&data.m_str.field_2 + 8),0);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_nullptr>
            ((EqHelper *)local_b8,"split_result.first","data.m_tokens[0]",
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_98,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  RandomTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::get_remainder(&local_f8,
                  (RandomTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                   *)&split_result.second._M_str,1);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_nullptr>
            ((EqHelper *)local_d8,"split_result.second","data.get_remainder(1)",
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&split_result.first._M_str,
             &local_f8);
  std::__cxx11::wstring::~wstring((wstring *)&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=(local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  RandomTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::~RandomTestData((RandomTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                     *)&split_result.second._M_str);
  return;
}

Assistant:

TYPED_TEST(SplitOnceTest, random_view) {
	RandomTestData<TypeParam> data{};
	std::pair<std::basic_string_view<TypeParam>, std::basic_string_view<TypeParam>> split_result = split_once_view(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}